

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

char * mp_encode_array(char *data,uint32_t size)

{
  char *pcVar1;
  uint32_t size_local;
  char *data_local;
  
  if (size < 0x10) {
    data_local = mp_store_u8(data,(byte)size | 0x90);
  }
  else if (size < 0x10000) {
    pcVar1 = mp_store_u8(data,0xdc);
    data_local = mp_store_u16(pcVar1,(uint16_t)size);
  }
  else {
    pcVar1 = mp_store_u8(data,0xdd);
    data_local = mp_store_u32(pcVar1,size);
  }
  return data_local;
}

Assistant:

MP_IMPL char *
mp_encode_array(char *data, uint32_t size)
{
	if (size <= 15) {
		return mp_store_u8(data, 0x90 | size);
	} else if (size <= UINT16_MAX) {
		data = mp_store_u8(data, 0xdc);
		data = mp_store_u16(data, size);
		return data;
	} else {
		data = mp_store_u8(data, 0xdd);
		return mp_store_u32(data, size);
	}
}